

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
wabt::MakeUnique<wabt::AssertReturnCommand>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>,_true,_true>
  in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x30);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined4 *)(puVar1 + 1) = 7;
  *puVar1 = &PTR__AssertReturnCommand_001d7608;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
   ._M_t.
   super__Tuple_impl<0UL,_wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>
   .super__Head_base<0UL,_wabt::AssertReturnCommand_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>,_true,_true>
          )(tuple<wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>)
           in_RDI.
           super___uniq_ptr_impl<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>
           .super__Head_base<0UL,_wabt::AssertReturnCommand_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}